

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pl_SHA2.cc
# Opt level: O3

void __thiscall Pl_SHA2::Pl_SHA2(Pl_SHA2 *this,int bits,Pipeline *next)

{
  Pipeline::Pipeline(&this->super_Pipeline,"sha2",next);
  (this->super_Pipeline)._vptr_Pipeline = (_func_int **)&PTR__Pl_SHA2_002ea7a8;
  this->in_progress = false;
  (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->crypto).super___shared_ptr<QPDFCryptoImpl,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (bits != 0) {
    resetBits(this,bits);
  }
  return;
}

Assistant:

Pl_SHA2::Pl_SHA2(int bits, Pipeline* next) :
    Pipeline("sha2", next),
    in_progress(false)
{
    if (bits) {
        resetBits(bits);
    }
}